

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_mulw(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx_00;
  TCGv_i32 arg;
  TCGv_i32 ret;
  TCGv_i32 arg2;
  ea_what what;
  bool bVar1;
  int sign;
  TCGv_i32 src;
  TCGv_i32 tmp;
  TCGv_i32 reg;
  TCGContext_conflict2 *tcg_ctx;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  bVar1 = (insn & 0x100) != 0;
  arg = tcg_ctx_00->cpu_dregs[(int)((int)(uint)insn >> 9 & 7)];
  ret = tcg_temp_new_i32(tcg_ctx_00);
  if (bVar1) {
    tcg_gen_ext16s_i32_m68k(tcg_ctx_00,ret,arg);
  }
  else {
    tcg_gen_ext16u_i32_m68k(tcg_ctx_00,ret,arg);
  }
  what = EA_LOADU;
  if (bVar1) {
    what = EA_LOADS;
  }
  arg2 = gen_ea(env,s,insn,1,tcg_ctx_00->NULL_QREG,(TCGv_i32 *)0x0,what,
                (uint)(((((s->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
  if (arg2 == tcg_ctx_00->NULL_QREG) {
    gen_addr_fault(s);
  }
  else {
    tcg_gen_mul_i32(tcg_ctx_00,ret,ret,arg2);
    tcg_gen_mov_i32(tcg_ctx_00,arg,ret);
    gen_logic_cc(s,ret,2);
    tcg_temp_free_i32(tcg_ctx_00,ret);
  }
  return;
}

Assistant:

DISAS_INSN(mulw)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv reg;
    TCGv tmp;
    TCGv src;
    int sign;

    sign = (insn & 0x100) != 0;
    reg = DREG(insn, 9);
    tmp = tcg_temp_new(tcg_ctx);
    if (sign)
        tcg_gen_ext16s_i32(tcg_ctx, tmp, reg);
    else
        tcg_gen_ext16u_i32(tcg_ctx, tmp, reg);
    SRC_EA(env, src, OS_WORD, sign, NULL);
    tcg_gen_mul_i32(tcg_ctx, tmp, tmp, src);
    tcg_gen_mov_i32(tcg_ctx, reg, tmp);
    gen_logic_cc(s, tmp, OS_LONG);
    tcg_temp_free(tcg_ctx, tmp);
}